

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

GLFWglproc glfwGetProcAddress(char *procname)

{
  void *pvVar1;
  GLFWglproc p_Var2;
  char *format;
  int code;
  
  if (procname == (char *)0x0) {
    __assert_fail("procname != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/src/context.c"
                  ,0x2ea,"GLFWglproc glfwGetProcAddress(const char *)");
  }
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (pvVar1 != (void *)0x0) {
      p_Var2 = (GLFWglproc)(**(code **)((long)pvVar1 + 0x260))(procname);
      return p_Var2;
    }
    format = "Cannot query entry point without a current OpenGL or OpenGL ES context";
    code = 0x10002;
  }
  _glfwInputError(code,format);
  return (GLFWglproc)0x0;
}

Assistant:

GLFWAPI GLFWglproc glfwGetProcAddress(const char* procname)
{
    _GLFWwindow* window;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query entry point without a current OpenGL or OpenGL ES context");
        return NULL;
    }

    return window->context.getProcAddress(procname);
}